

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoints.cpp
# Opt level: O3

void __thiscall
helics::Endpoint::Endpoint
          (Endpoint *this,InterfaceVisibility locality,MessageFederate *mFed,string_view name,
          string_view type)

{
  Core **ppCVar1;
  string *this_00;
  MessageFederate *pMVar2;
  undefined8 uVar3;
  int iVar4;
  undefined4 uVar5;
  Endpoint *pEVar6;
  
  ppCVar1 = &(this->super_Interface).mCore;
  (this->super_Interface).mCore = (Core *)0x0;
  (this->super_Interface).handle.hid = -1700000000;
  this_00 = &(this->super_Interface).mName;
  (this->super_Interface).mName._M_dataplus._M_p = (pointer)&(this->super_Interface).mName.field_2;
  (this->super_Interface).mName._M_string_length = 0;
  (this->super_Interface).mName.field_2._M_local_buf[0] = '\0';
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR__Endpoint_004caf08;
  this->fed = (MessageFederate *)0x0;
  this->referenceIndex = -1;
  this->dataReference = (void *)0x0;
  this->disableAssign = false;
  this->receiveOnly = false;
  (this->defDest)._M_dataplus._M_p = (pointer)&(this->defDest).field_2;
  (this->defDest)._M_string_length = 0;
  (this->defDest).field_2._M_local_buf[0] = '\0';
  if (locality == GLOBAL) {
    pEVar6 = helics::MessageFederate::registerGlobalEndpoint(mFed,name,type);
    (this->super_Interface).handle.hid = (pEVar6->super_Interface).handle.hid;
    *ppCVar1 = (pEVar6->super_Interface).mCore;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(pEVar6->super_Interface).mName);
  }
  else {
    pEVar6 = helics::MessageFederate::registerEndpoint(mFed,name,type);
    (this->super_Interface).handle.hid = (pEVar6->super_Interface).handle.hid;
    *ppCVar1 = (pEVar6->super_Interface).mCore;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(pEVar6->super_Interface).mName);
  }
  pMVar2 = pEVar6->fed;
  iVar4 = pEVar6->referenceIndex;
  uVar5 = *(undefined4 *)&pEVar6->field_0x44;
  uVar3 = *(undefined8 *)((long)&pEVar6->dataReference + 2);
  *(undefined8 *)((long)&this->referenceIndex + 2) =
       *(undefined8 *)((long)&pEVar6->referenceIndex + 2);
  *(undefined8 *)((long)&this->dataReference + 2) = uVar3;
  this->fed = pMVar2;
  this->referenceIndex = iVar4;
  *(undefined4 *)&this->field_0x44 = uVar5;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->defDest,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pEVar6->defDest);
  return;
}

Assistant:

Endpoint::Endpoint(InterfaceVisibility locality,
                   MessageFederate* mFed,
                   std::string_view name,
                   std::string_view type)
{
    if (locality == InterfaceVisibility::GLOBAL) {
        operator=(mFed->registerGlobalEndpoint(name, type));
    } else {
        operator=(mFed->registerEndpoint(name, type));
    }
}